

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O3

bool __thiscall
cli::Parser::CmdFunction<bool>::parse(CmdFunction<bool> *this,ostream *output,ostream *error)

{
  bool bVar1;
  undefined8 uVar2;
  bool bVar3;
  CallbackArgs args;
  CallbackArgs local_20;
  
  local_20.arguments = &(this->super_CmdBase).arguments;
  bVar3 = (this->callback).super__Function_base._M_manager == (_Manager_type)0x0;
  local_20.output = output;
  local_20.error = error;
  if (bVar3) {
    uVar2 = std::__throw_bad_function_call();
    __cxa_begin_catch(uVar2);
    __cxa_end_catch();
  }
  else {
    bVar1 = (*(this->callback)._M_invoker)((_Any_data *)&this->callback,&local_20);
    this->value = bVar1;
  }
  return !bVar3;
}

Assistant:

virtual bool parse(std::ostream& output, std::ostream& error) {
				try {
					CallbackArgs args { arguments, output, error };
					value = callback(args);
					return true;
				} catch (...) {
					return false;
				}
			}